

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O2

bool __thiscall ON_ModelComponent::SetId(ON_ModelComponent *this,ON_UUID *component_id)

{
  ushort uVar1;
  undefined8 uVar2;
  unsigned_short uVar3;
  unsigned_short uVar4;
  bool bVar5;
  
  uVar1 = this->m_locked_status;
  if ((uVar1 & 8) == 0) {
    bVar5 = ::operator==(&this->m_component_id,component_id);
    uVar3 = component_id->Data2;
    uVar4 = component_id->Data3;
    uVar2 = *(undefined8 *)component_id->Data4;
    (this->m_component_id).Data1 = component_id->Data1;
    (this->m_component_id).Data2 = uVar3;
    (this->m_component_id).Data3 = uVar4;
    *(undefined8 *)(this->m_component_id).Data4 = uVar2;
    *(byte *)&this->m_set_status = (byte)this->m_set_status | 8;
    if (!bVar5) {
      this->m_content_version_number = this->m_content_version_number + 1;
    }
  }
  return (uVar1 & 8) == 0;
}

Assistant:

bool ON_ModelComponent::SetId(
  const ON_UUID& component_id
  )
{
  const unsigned int bit = ON_ModelComponent::Attributes::IdAttribute;
  if (0 != (bit & m_locked_status))
    return false;

  const bool bContentChange = (false == (m_component_id == component_id));
  m_component_id = component_id;
  m_set_status |= bit;
  if ( bContentChange )
    IncrementContentVersionNumber();

  return true;
}